

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationResult.cpp
# Opt level: O1

void __thiscall SimulationResult::Load(SimulationResult *this,string *filename)

{
  pointer pdVar1;
  iterator __position;
  char cVar2;
  uint uVar3;
  istream *piVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double dVar8;
  undefined8 extraout_XMM1_Qa;
  undefined1 extraout_var [56];
  string buffer;
  double r;
  stringstream ss;
  ifstream fp;
  undefined1 *local_3e8;
  undefined8 local_3e0;
  undefined1 local_3d8;
  undefined7 uStack_3d7;
  double local_3c8;
  istringstream local_3c0 [16];
  ostream local_3b0 [104];
  ios_base local_348 [272];
  long local_238 [4];
  byte abStack_218 [488];
  undefined1 auVar10 [64];
  undefined1 auVar9 [16];
  
  std::ifstream::ifstream((istream *)local_238,(filename->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_3b0,"SimulationResult::Load: failed to ",0x22);
    std::__ostream_insert<char,std::char_traits<char>>(local_3b0,"open file ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_3b0,(filename->_M_dataplus)._M_p,filename->_M_string_length);
    puVar6 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar6 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    __cxa_throw(puVar6,&E::typeinfo,E::~E);
  }
  pdVar1 = (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  local_3e8 = &local_3d8;
  local_3e0 = 0;
  local_3d8 = 0;
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    auVar10._8_56_ = extraout_var;
    auVar10._0_8_ = extraout_XMM1_Qa;
    auVar9 = auVar10._0_16_;
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3e8,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 2) != 0) break;
    std::__cxx11::istringstream::istringstream(local_3c0,(string *)&local_3e8,_S_in);
    std::istream::_M_extract<double>((double *)local_3c0);
    __position._M_current =
         (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                ((vector<double,std::allocator<double>> *)&this->_m_rewards,__position,&local_3c8);
    }
    else {
      *__position._M_current = local_3c8;
      (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    std::__cxx11::istringstream::~istringstream(local_3c0);
    std::ios_base::~ios_base(local_348);
  }
  pdVar1 = (this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (ulong)((long)(this->_m_rewards).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3;
  uVar3 = (uint)uVar5;
  this->_m_nr_stored = uVar3;
  if (uVar3 == 0) {
    dVar8 = 0.0;
  }
  else {
    dVar8 = 0.0;
    uVar7 = 0;
    do {
      dVar8 = dVar8 + pdVar1[uVar7];
      uVar7 = uVar7 + 1;
    } while ((uVar5 & 0xffffffff) != uVar7);
  }
  auVar9 = vcvtusi2sd_avx512f(auVar9,uVar3);
  this->_m_avg_reward =
       (double)((ulong)(uVar3 == 0) * 0x7fefffffffffffff +
               (ulong)(uVar3 != 0) * (long)(dVar8 / auVar9._0_8_));
  if (local_3e8 != &local_3d8) {
    operator_delete(local_3e8,CONCAT71(uStack_3d7,local_3d8) + 1);
  }
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

void SimulationResult::Load(string filename)
{
    double r;

    ifstream fp(filename.c_str());
    if(!fp)
    {
        stringstream ss;
        ss << "SimulationResult::Load: failed to "
           << "open file " << filename;
        throw E(ss);
    }

    _m_rewards.clear();

    string buffer;
    while(!getline(fp,buffer).eof())
    {
        istringstream is(buffer);
        is >> r;
        _m_rewards.push_back(r);
    }

    _m_nr_stored=_m_rewards.size();
    UpdateStatistics();
}